

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O1

ztast_t * ztast_create(ztast_mallocfn_t *mallocfn,ztast_freefn_t *freefn,void *opaque,
                      ztast_logfn_t *logfn)

{
  ztast_t *pzVar1;
  
  pzVar1 = (ztast_t *)(*mallocfn)(0x20,opaque);
  if (pzVar1 == (ztast_t *)0x0) {
    pzVar1 = (ztast_t *)0x0;
  }
  else {
    pzVar1->program = (ztast_program_t *)0x0;
    pzVar1->mallocfn = mallocfn;
    pzVar1->freefn = freefn;
    pzVar1->opaque = opaque;
  }
  return pzVar1;
}

Assistant:

ztast_t *ztast_create(ztast_mallocfn_t  *mallocfn,
                      ztast_freefn_t    *freefn,
                      void              *opaque,
                      ztast_logfn_t     *logfn)
{
  ztast_t *ast;

  ast = mallocfn(sizeof(*ast), opaque);
  if (ast == NULL)
    return NULL;

  ast->program  = NULL;
  
  ast->mallocfn = mallocfn;
  ast->freefn   = freefn;
  ast->opaque   = opaque;

#ifdef ZTAST_LOG
  ast->logfn     = logfn;
#endif

  return ast;
}